

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__filename;
  XMVFrameSpec *pXVar1;
  int iVar2;
  undefined8 in_RAX;
  FILE *__stream;
  XMV *xmv;
  char *pcVar3;
  int *piVar4;
  long lVar5;
  int i;
  ulong uVar6;
  LPStatus status;
  
  status = (LPStatus)((ulong)in_RAX >> 0x20);
  progname = *argv;
  iVar2 = LPGetopt(argc,argv,"h");
  if (iVar2 == -1) {
    if (_optind < argc) {
      __filename = argv[_optind];
      __stream = fopen(__filename,"rb");
      if (__stream == (FILE *)0x0) {
        piVar4 = __errno_location();
        pcVar3 = strerror(*piVar4);
        xmv = (XMV *)0x0;
        LPWarn("xmv","couldn\'t open %s: %s",__filename,pcVar3);
      }
      else {
        xmv = XMV_NewFromFile((FILE *)__stream,&status);
        if (status == LUNAPURPURA_OK) {
          fclose(__stream);
          LPLog("xmv","%s: This is XMV type %d",__filename,(ulong)xmv->type);
          LPLog("xmv","%d total frames",(ulong)xmv->n_frames);
          lVar5 = 0xe;
          for (uVar6 = 0; uVar6 < xmv->n_frames; uVar6 = uVar6 + 1) {
            pXVar1 = xmv->frames;
            printf("frame=%02d\t%d\t%d,%d,%d,%d,%d,%d\n",uVar6 & 0xffffffff,
                   (ulong)*(ushort *)((long)pXVar1 + lVar5 + -0xe),
                   (ulong)*(ushort *)((long)pXVar1 + lVar5 + -10),
                   (ulong)*(ushort *)((long)pXVar1 + lVar5 + -8),
                   (ulong)*(ushort *)((long)pXVar1 + lVar5 + -6),
                   (ulong)*(ushort *)((long)pXVar1 + lVar5 + -4),
                   (ulong)*(ushort *)((long)pXVar1 + lVar5 + -2),
                   (ulong)*(ushort *)((long)&pXVar1->marker + lVar5));
            lVar5 = lVar5 + 0x10;
          }
          XMV_Free(xmv);
          return 0;
        }
        pcVar3 = LPStatusString(status);
        LPWarn("xmv","couldn\'t read %s: %s",__filename,pcVar3);
        fclose(__stream);
      }
      XMV_Free(xmv);
      return 1;
    }
  }
  else if (iVar2 == 0x68) {
    usage();
    return 0;
  }
  usage();
  return 1;
}

Assistant:

int
main(int argc, char *argv[])
{
#ifdef LUNAPURPURA_HAVE_GETPROGNAME
	progname = (char *)getprogname();
#else
	progname = argv[0];
#endif

	int ch;

	while ((ch = LPGetopt(argc, argv, "h")) != -1) {
		switch (ch) {
		case 'h':
			usage();
			return EXIT_SUCCESS;
			break;
		case '?': /* FALLTHROUGH */
		default:
			usage();
			return EXIT_FAILURE;
		}
	}
	argc -= optind;
	argv += optind;

	if (argc < 1) {
		usage();
		return EXIT_FAILURE;
	}

	XMV *xmv = NULL;

	const char *path = argv[0];
	FILE *xmv_fp = fopen(path, "rb");

	if (!xmv_fp) {
		LPWarn(LP_SUBSYSTEM_XMV, "couldn't open %s: %s", path, strerror(errno));
		goto fail;
	}

	LPStatus status;
	xmv = XMV_NewFromFile(xmv_fp, &status);

	if (status != LUNAPURPURA_OK) {
		LPWarn(LP_SUBSYSTEM_XMV, "couldn't read %s: %s", path, LPStatusString(status));
		goto fail;
	}

	fclose(xmv_fp);

	LPLog(LP_SUBSYSTEM_XMV, "%s: This is XMV type %d", path, xmv->type);
	LPLog(LP_SUBSYSTEM_XMV, "%d total frames", xmv->n_frames);

	for (int i = 0; i < xmv->n_frames; i++) {
		XMVFrameSpec frame = xmv->frames[i];
		printf(
			"frame=%02d\t%d\t%d,%d,%d,%d,%d,%d\n",
			i,
			frame.marker,
			frame.a, frame.b, frame.c, frame.d, frame.e, frame.f
		);
	}

	XMV_Free(xmv);
	return EXIT_SUCCESS;

fail:
	if (xmv_fp) fclose(xmv_fp);
	XMV_Free(xmv);
	return EXIT_FAILURE;
}